

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  rawSeq *prVar1;
  BYTE *iend;
  BYTE *pBVar2;
  seqDef *psVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar7;
  ZSTD_dictMode_e dictMode;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  BYTE *pBVar11;
  long lVar12;
  BYTE *pBVar13;
  ulong uVar15;
  ulong uVar16;
  U32 UVar14;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
      dictMode = ZSTD_noDict;
    }
    else {
      dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
    }
  }
  uVar6 = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (ZSTD_btlazy2 < (ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar7;
  }
  if (rawSeqStore->size < rawSeqStore->pos) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7efb,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  if (rawSeqStore->capacity < rawSeqStore->size) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7efc,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  pBVar13 = (BYTE *)(srcSize + (long)src);
  do {
    uVar15 = rawSeqStore->pos;
    if ((rawSeqStore->size <= uVar15) || (pBVar13 <= src)) break;
    prVar1 = rawSeqStore->seq + uVar15;
    uVar16._0_4_ = prVar1->offset;
    uVar16._4_4_ = prVar1->litLength;
    if ((undefined4)uVar16 == 0) {
      __assert_fail("sequence.offset > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7ebd,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
    }
    uVar10 = uVar16 >> 0x20;
    uVar9 = rawSeqStore->seq[uVar15].matchLength;
    uVar5 = (uint)((long)pBVar13 - (long)src);
    if (uVar5 < uVar9 + uVar16._4_4_) {
      uVar15 = uVar16;
      if (uVar5 - uVar16._4_4_ < uVar6) {
        uVar15 = 0;
      }
      uVar8 = uVar5 - uVar16._4_4_;
      if (uVar5 < (uint)uVar16._4_4_ || uVar5 - uVar16._4_4_ == 0) {
        uVar15 = 0;
        uVar8 = uVar9;
      }
      uVar9 = uVar8;
      ZSTD_ldm_skipSequences(rawSeqStore,(long)pBVar13 - (long)src & 0xffffffff,uVar6);
      uVar16 = uVar15;
    }
    else {
      rawSeqStore->pos = uVar15 + 1;
    }
    UVar14 = (U32)uVar16;
    if (UVar14 != 0) {
      iend = (BYTE *)((long)src + uVar10);
      if (pBVar13 < iend + uVar9) {
        __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7f07,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                     );
      }
      uVar5 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar5) {
        uVar8 = (uVar5 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar8) {
          uVar8 = 0x200;
        }
        ms->nextToUpdate = uVar5 - uVar8;
      }
      ZSTD_ldm_fillFastTables(ms,src);
      sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar10);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = UVar14;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar2 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar2 + sVar7) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar13 < iend) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar11 = iend + -sVar7;
      if (pBVar13 + -0x20 < iend) {
        ZSTD_safecopyLiterals(pBVar2,pBVar11,iend,pBVar13 + -0x20);
      }
      else {
        uVar4 = *(undefined8 *)(pBVar11 + 8);
        *(undefined8 *)pBVar2 = *(undefined8 *)pBVar11;
        *(undefined8 *)(pBVar2 + 8) = uVar4;
        if (0x10 < sVar7) {
          pBVar2 = seqStore->lit;
          if ((BYTE *)0xffffffffffffffe0 < pBVar2 + 0x10 + (-0x10 - (long)(pBVar11 + 0x10))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar4 = *(undefined8 *)(pBVar11 + 0x18);
          *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)(pBVar11 + 0x10);
          *(undefined8 *)(pBVar2 + 0x18) = uVar4;
          if (0x20 < (long)sVar7) {
            lVar12 = 0;
            do {
              uVar4 = *(undefined8 *)((BYTE *)((long)src + lVar12 + (uVar10 - sVar7) + 0x20) + 8);
              pBVar11 = pBVar2 + lVar12 + 0x20;
              *(undefined8 *)pBVar11 = *(undefined8 *)((long)src + lVar12 + (uVar10 - sVar7) + 0x20)
              ;
              *(undefined8 *)(pBVar11 + 8) = uVar4;
              uVar4 = *(undefined8 *)((BYTE *)((long)src + lVar12 + (uVar10 - sVar7) + 0x30) + 8);
              *(undefined8 *)(pBVar11 + 0x10) =
                   *(undefined8 *)((long)src + lVar12 + (uVar10 - sVar7) + 0x30);
              *(undefined8 *)(pBVar11 + 0x18) = uVar4;
              lVar12 = lVar12 + 0x20;
            } while (pBVar11 + 0x20 < pBVar2 + sVar7);
          }
        }
      }
      seqStore->lit = seqStore->lit + sVar7;
      if (0xffff < sVar7) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      psVar3 = seqStore->sequences;
      psVar3->litLength = (U16)sVar7;
      psVar3->offBase = UVar14 + 3;
      if (uVar9 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar15 = (ulong)uVar9 - 3;
      if (0xffff < uVar15) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar3->mlBase = (U16)uVar15;
      seqStore->sequences = psVar3 + 1;
      src = iend + uVar9;
    }
  } while (UVar14 != 0);
  uVar6 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar6) {
    uVar9 = (uVar6 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar9) {
      uVar9 = 0x200;
    }
    ms->nextToUpdate = uVar6 - uVar9;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pBVar13 - (long)src);
  return sVar7;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}